

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O3

void ui_wrap_text(wchar_t width,char *input,wchar_t *output_count,char ***output)

{
  byte bVar1;
  size_t sVar2;
  char **ppcVar3;
  long lVar4;
  ushort **ppuVar5;
  char *pcVar6;
  ulong uVar7;
  byte *pbVar8;
  int iVar9;
  ulong uVar10;
  size_t __n;
  int iVar11;
  bool bVar12;
  
  sVar2 = strlen(input);
  ppcVar3 = (char **)malloc(0xa0);
  *output = ppcVar3;
  lVar4 = 0;
  do {
    (*output)[lVar4] = (char *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x14);
  iVar9 = 0;
  uVar10 = 0;
  while (width < (int)sVar2 - iVar9) {
    ppuVar5 = __ctype_b_loc();
    iVar11 = width + L'\x01' + iVar9;
    lVar4 = (long)(iVar9 + width);
    do {
      pbVar8 = (byte *)(input + lVar4);
      iVar11 = iVar11 + -1;
      if (((*ppuVar5)[*pbVar8] >> 0xd & 1) != 0) break;
      bVar12 = (long)iVar9 + 0x14 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar12);
    if (((*ppuVar5)[*pbVar8] >> 0xd & 1) == 0) {
      iVar11 = iVar9 + width;
    }
    __n = (size_t)(iVar11 - iVar9);
    pcVar6 = (char *)malloc(__n + 1);
    strncpy(pcVar6,input + iVar9,__n);
    pcVar6[__n] = '\0';
    (*output)[uVar10] = pcVar6;
    lVar4 = ((long)iVar11 << 0x20) + -0x100000000;
    iVar9 = iVar11 + -1;
    pbVar8 = (byte *)(input + iVar11);
    do {
      lVar4 = lVar4 + 0x100000000;
      bVar1 = *pbVar8;
      iVar9 = iVar9 + 1;
      pbVar8 = pbVar8 + 1;
    } while ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
    uVar7 = uVar10 + 1;
    if ((input[lVar4 >> 0x20] == '\0') || (bVar12 = 0x12 < uVar10, uVar10 = uVar7, bVar12))
    goto LAB_0010f4d7;
  }
  pcVar6 = strdup(input + iVar9);
  (*output)[uVar10] = pcVar6;
  uVar7 = (ulong)((int)uVar10 + 1);
LAB_0010f4d7:
  *output_count = (wchar_t)uVar7;
  return;
}

Assistant:

void ui_wrap_text(int width, const char *input, int *output_count, char ***output)
{
    const int min_width = 20, max_wrap = 20;

    int len = strlen(input);
    int input_idx, input_lidx;
    int idx, outcount;

    *output = malloc(max_wrap * sizeof(char *));
    for (idx = 0; idx < max_wrap; idx++)
	(*output)[idx] = NULL;

    input_idx = 0;
    outcount = 0;
    do {
	size_t outsize;
	char *outbuf;

	if (len - input_idx <= width) {
	    /* enough room for the rest of the input */
	    (*output)[outcount] = strdup(input + input_idx);
	    outcount++;
	    break;
	}

	/* find nearest space in input to right edge that doesn't exceed width */
	input_lidx = input_idx + width;
	while (!isspace((unsigned char)input[input_lidx]) &&
	       input_lidx - input_idx > min_width)
	    input_lidx--;
	/* didn't find a space, so just go with width-worth of characters */
	if (!isspace((unsigned char)input[input_lidx]))
	    input_lidx = input_idx + width;

	outsize = input_lidx - input_idx;
	outbuf = malloc(outsize + 1);
	strncpy(outbuf, input + input_idx, outsize);
	outbuf[outsize] = '\0';
	(*output)[outcount] = outbuf;
	outcount++;

	/* skip extra spaces in break */
	input_idx = input_lidx;
	while (isspace((unsigned char)input[input_idx]))
	    input_idx++;
    } while (input[input_idx] && outcount < max_wrap);

    *output_count = outcount;
}